

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IcePoint.cpp
# Opt level: O0

void __thiscall
IceMaths::Point::ProjectToScreen
          (Point *this,float halfrenderwidth,float halfrenderheight,Matrix4x4 *mat,HPoint *projected
          )

{
  undefined1 local_a8 [16];
  HPoint local_98;
  HPoint *local_88;
  HPoint *projected_local;
  Matrix4x4 *mat_local;
  float halfrenderheight_local;
  float halfrenderwidth_local;
  Point *this_local;
  float local_60;
  float local_5c;
  Matrix4x4 *local_58;
  float local_1c;
  float local_18;
  float local_14;
  Matrix4x4 *local_10;
  
  local_5c = this->x;
  local_60 = this->y;
  this_local._4_4_ = this->z;
  local_58 = (Matrix4x4 *)local_a8;
  this_local._0_4_ = 0x3f800000;
  local_a8._12_4_ = 1.0;
  local_88 = projected;
  projected_local = (HPoint *)mat;
  mat_local._0_4_ = halfrenderheight;
  mat_local._4_4_ = halfrenderwidth;
  _halfrenderheight_local = this;
  local_1c = this_local._4_4_;
  local_18 = local_60;
  local_14 = local_5c;
  local_10 = local_58;
  local_a8._0_4_ = local_5c;
  local_a8._4_4_ = local_60;
  local_a8._8_4_ = this_local._4_4_;
  HPoint::operator*(&local_98,local_58);
  (local_88->super_Point).x = local_98.super_Point.x;
  (local_88->super_Point).y = local_98.super_Point.y;
  *(undefined8 *)&(local_88->super_Point).z = local_98._8_8_;
  local_88->w = 1.0 / local_88->w;
  (local_88->super_Point).x = local_88->w * (local_88->super_Point).x;
  (local_88->super_Point).y = local_88->w * (local_88->super_Point).y;
  (local_88->super_Point).z = local_88->w * (local_88->super_Point).z;
  (local_88->super_Point).x = mat_local._4_4_ * (local_88->super_Point).x;
  (local_88->super_Point).x = mat_local._4_4_ + (local_88->super_Point).x;
  (local_88->super_Point).y = -mat_local._0_4_ * (local_88->super_Point).y;
  (local_88->super_Point).y = mat_local._0_4_ + (local_88->super_Point).y;
  return;
}

Assistant:

void Point::ProjectToScreen(float halfrenderwidth, float halfrenderheight, const Matrix4x4& mat, HPoint& projected) const
{
	projected = HPoint(x, y, z, 1.0f) * mat;
	projected.w = 1.0f / projected.w;

	projected.x*=projected.w;
	projected.y*=projected.w;
	projected.z*=projected.w;

	projected.x *= halfrenderwidth;		projected.x += halfrenderwidth;
	projected.y *= -halfrenderheight;	projected.y += halfrenderheight;
}